

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::Errors::RBDLDofMismatchError::RBDLDofMismatchError
          (RBDLDofMismatchError *this,string *text)

{
  string *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc8;
  RBDLError *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,in_RSI);
  RBDLError::RBDLError(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  *in_RDI = &PTR__RBDLDofMismatchError_00940900;
  return;
}

Assistant:

RBDLDofMismatchError::RBDLDofMismatchError(std::string text): RBDLError(text) {}